

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O3

void __thiscall
QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(QPDFFormFieldObjectHelper *this)

{
  Members *__p;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  QPDFObjectHandle::newNull();
  if (local_18 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->super_QPDFObjectHelper).super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_20;
    (this->super_QPDFObjectHelper).super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
         (_func_int **)&PTR__QPDFObjectHelper_002eece8;
    (this->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (this->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_use_count = local_18->_M_use_count + 1;
      UNLOCK();
      (this->super_QPDFObjectHelper).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_20;
      (this->super_QPDFObjectHelper).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_18;
      (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
           (_func_int **)&PTR__QPDFObjectHelper_002eece8;
      (this->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (this->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (local_18 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001683f1;
    }
    else {
      local_18->_M_use_count = local_18->_M_use_count + 1;
      (this->super_QPDFObjectHelper).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_20;
      (this->super_QPDFObjectHelper).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_18;
      (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
           (_func_int **)&PTR__QPDFObjectHelper_002eece8;
      (this->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (this->super_QPDFObjectHelper).oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
LAB_001683f1:
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFFormFieldObjectHelper_002ec018;
  __p = (Members *)operator_new(1);
  (this->m).super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<QPDFFormFieldObjectHelper::Members*>
            (&(this->m).
              super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p);
  return;
}

Assistant:

QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper() :
    QPDFObjectHelper(QPDFObjectHandle::newNull()),
    m(new Members())
{
}